

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O1

Status __thiscall
leveldb::anon_unknown_1::PosixSequentialFile::Read
          (PosixSequentialFile *this,size_t n,Slice *result,char *scratch)

{
  _func_int **pp_Var1;
  ssize_t sVar2;
  int *piVar3;
  void *in_R8;
  long in_FS_OFFSET;
  _func_int **local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_SequentialFile)._vptr_SequentialFile = (_func_int **)0x0;
  do {
    sVar2 = read(*(int *)(n + 8),in_R8,(size_t)result);
    if (-1 < sVar2) {
      *(void **)scratch = in_R8;
      *(ssize_t *)(scratch + 8) = sVar2;
      goto LAB_00d4d2bb;
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  PosixError((anon_unknown_1 *)&local_38,(string *)(n + 0x10),*piVar3);
  pp_Var1 = (this->super_SequentialFile)._vptr_SequentialFile;
  (this->super_SequentialFile)._vptr_SequentialFile = local_38;
  local_38 = pp_Var1;
  if (pp_Var1 != (_func_int **)0x0) {
    operator_delete__(pp_Var1);
  }
LAB_00d4d2bb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status Read(size_t n, Slice* result, char* scratch) override {
    Status status;
    while (true) {
      ::ssize_t read_size = ::read(fd_, scratch, n);
      if (read_size < 0) {  // Read error.
        if (errno == EINTR) {
          continue;  // Retry
        }
        status = PosixError(filename_, errno);
        break;
      }
      *result = Slice(scratch, read_size);
      break;
    }
    return status;
  }